

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

bool absl::lts_20240722::anon_unknown_8::FindTransition
               (time_zone *tz,offset_in_time_zone_to_subr find_transition,Time t,
               CivilTransition *trans)

{
  Time t_00;
  ulong uVar1;
  HiRep HVar2;
  duration in_R9;
  bool bVar3;
  code *local_108;
  civil_time<absl::lts_20240722::time_internal::second_tag> local_e0;
  civil_time<absl::lts_20240722::time_internal::second_tag> local_d0;
  undefined1 local_c0 [8];
  civil_transition tr;
  int64_t local_80;
  duration<long,std::ratio<1l,1l>> local_78 [8];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  local_70;
  duration local_68;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tp;
  CivilTransition *trans_local;
  offset_in_time_zone_to_subr find_transition_local;
  time_zone *tz_local;
  Time t_local;
  
  HVar2.hi_ = (uint32_t)((ulong)register0x00000008 >> 0x20);
  HVar2.lo_ = t.rep_.rep_lo_;
  tp.__d.__r = (duration)(duration)in_R9.__r;
  local_70.__d.__r = (duration)unix_epoch();
  t_00.rep_.rep_lo_ = (uint32_t)trans;
  t_00.rep_.rep_hi_ = HVar2;
  tr.to.f_._8_8_ = HVar2;
  local_80 = ToUnixSeconds(t_00);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>(local_78,&local_80);
  local_68.__r = (rep)std::chrono::operator+
                                (&local_70,(duration<long,_std::ratio<1L,_1L>_> *)local_78);
  time_internal::cctz::time_zone::civil_transition::civil_transition((civil_transition *)local_c0);
  local_108 = (code *)find_transition;
  if ((find_transition & 1) != 0) {
    local_108 = *(code **)(*(long *)(tz + (long)t.rep_.rep_hi_) + (find_transition - 1));
  }
  uVar1 = (*local_108)(tz + (long)t.rep_.rep_hi_,&local_68,local_c0);
  bVar3 = (uVar1 & 1) != 0;
  if (bVar3) {
    time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::second_tag>::
    civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>
              (&local_d0,
               (civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag> *)local_c0,
               (preserves_data<absl::lts_20240722::time_internal::cctz::detail::second_tag,_absl::lts_20240722::time_internal::second_tag>
                *)0x0);
    *(int_least64_t *)tp.__d.__r = local_d0.f_.y;
    *(undefined8 *)((long)tp.__d.__r + 8) = local_d0.f_._8_8_;
    time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::second_tag>::
    civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>
              (&local_e0,
               (civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag> *)
               &tr.from.f_.m,
               (preserves_data<absl::lts_20240722::time_internal::cctz::detail::second_tag,_absl::lts_20240722::time_internal::second_tag>
                *)0x0);
    *(int_least64_t *)((long)tp.__d.__r + 0x10) = local_e0.f_.y;
    *(undefined8 *)((long)tp.__d.__r + 0x18) = local_e0.f_._8_8_;
  }
  return bVar3;
}

Assistant:

bool FindTransition(const cctz::time_zone& tz,
                    bool (cctz::time_zone::*find_transition)(
                        const cctz::time_point<cctz::seconds>& tp,
                        cctz::time_zone::civil_transition* trans) const,
                    Time t, TimeZone::CivilTransition* trans) {
  // Transitions are second-aligned, so we can discard any fractional part.
  const auto tp = unix_epoch() + cctz::seconds(ToUnixSeconds(t));
  cctz::time_zone::civil_transition tr;
  if (!(tz.*find_transition)(tp, &tr)) return false;
  trans->from = CivilSecond(tr.from);
  trans->to = CivilSecond(tr.to);
  return true;
}